

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

bool __thiscall
GenericAssemblerFile::seekPhysical(GenericAssemblerFile *this,int64_t physicalAddress)

{
  uint uVar1;
  fpos<__mbstate_t> local_30;
  int64_t local_20;
  int64_t physicalAddress_local;
  GenericAssemblerFile *this_local;
  
  local_20 = physicalAddress;
  physicalAddress_local = (int64_t)this;
  if (physicalAddress < 0) {
    Logger::queueError<>(Error,"Seeking to negative physical address");
    this_local._7_1_ = false;
  }
  else {
    if (physicalAddress + this->headerSize < 0) {
      Logger::queueError<>(Warning,"Seeking to physical address with negative virtual address");
    }
    this->virtualAddress = local_20 + this->headerSize;
    uVar1 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[4])();
    if ((uVar1 & 1) != 0) {
      std::fpos<__mbstate_t>::fpos(&local_30,local_20);
      std::ostream::seekp(&this->stream,local_30._M_off,local_30._M_state);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GenericAssemblerFile::seekPhysical(int64_t physicalAddress)
{
	if (physicalAddress < 0)
	{
		Logger::queueError(Logger::Error, "Seeking to negative physical address");
		return false;
	}
	if (physicalAddress + headerSize < 0)
		Logger::queueError(Logger::Warning, "Seeking to physical address with negative virtual address");

	virtualAddress = physicalAddress+headerSize;

	if (isOpen())
		stream.seekp(physicalAddress);

	return true;
}